

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mgsession-encoder.c
# Opt level: O0

int mg_session_write_local_date_time(mg_session *session,mg_local_date_time *ldt)

{
  uint uVar1;
  uint uVar2;
  mg_session *in_RSI;
  int status_3;
  int status_2;
  int status_1;
  int status;
  undefined4 in_stack_ffffffffffffffdc;
  uint8_t val;
  uint in_stack_ffffffffffffffe0;
  undefined4 in_stack_ffffffffffffffe4;
  uint local_4;
  
  val = (uint8_t)((uint)in_stack_ffffffffffffffdc >> 0x18);
  uVar1 = mg_session_write_uint8
                    ((mg_session *)CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0),val
                    );
  local_4 = uVar1;
  if ((((uVar1 == 0) &&
       (uVar2 = mg_session_write_uint8((mg_session *)(ulong)in_stack_ffffffffffffffe0,val),
       local_4 = uVar2, uVar2 == 0)) &&
      (local_4 = mg_session_write_integer(in_RSI,(ulong)uVar1 << 0x20), local_4 == 0)) &&
     (local_4 = mg_session_write_integer(in_RSI,CONCAT44(uVar1,uVar2)), local_4 == 0)) {
    local_4 = 0;
  }
  return local_4;
}

Assistant:

int mg_session_write_local_date_time(mg_session *session,
                                     const mg_local_date_time *ldt) {
  MG_RETURN_IF_FAILED(
      mg_session_write_uint8(session, (uint8_t)(MG_MARKER_TINY_STRUCT2)));
  MG_RETURN_IF_FAILED(
      mg_session_write_uint8(session, MG_SIGNATURE_LOCAL_DATE_TIME));
  MG_RETURN_IF_FAILED(mg_session_write_integer(session, ldt->seconds));
  MG_RETURN_IF_FAILED(mg_session_write_integer(session, ldt->nanoseconds));
  return 0;
}